

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

void __thiscall
GenericModelPrivate::encodeMime(GenericModelPrivate *this,QMimeData *data,QModelIndexList *indexes)

{
  GenericModelItem *pGVar1;
  bool bVar2;
  const_iterator o;
  QModelIndex *this_00;
  qsizetype qVar3;
  GenericModelItem **ppGVar4;
  QString local_170;
  iterator local_158;
  undefined1 local_148 [8];
  iterator i_1;
  QDataStream local_130 [8];
  QDataStream stream;
  undefined1 local_110 [8];
  QByteArray encoded;
  iterator local_e8;
  const_iterator local_d8;
  iterator local_c8;
  iterator local_b8;
  undefined1 local_a8 [8];
  iterator j;
  undefined1 local_90 [7];
  bool iToErase;
  undefined1 local_80 [8];
  iterator i;
  QModelIndex *idx;
  const_iterator __end1;
  const_iterator __begin1;
  QModelIndexList *__range1;
  QSet<GenericModelItem_*> itemsToSave;
  GenericModel *q;
  QModelIndexList *indexes_local;
  QMimeData *data_local;
  GenericModelPrivate *this_local;
  
  itemsToSave.q_hash.d = (Hash)q_func(this);
  QSet<GenericModelItem_*>::QSet((QSet<GenericModelItem_*> *)&__range1);
  __end1 = QList<QModelIndex>::begin(indexes);
  o = QList<QModelIndex>::end(indexes);
  while (bVar2 = QList<QModelIndex>::const_iterator::operator!=(&__end1,o), bVar2) {
    this_00 = QList<QModelIndex>::const_iterator::operator*(&__end1);
    bVar2 = QModelIndex::isValid(this_00);
    if (bVar2) {
      i.i.i.bucket = (size_t)itemForIndex(this,this_00);
      QSet<GenericModelItem_*>::operator<<
                ((QSet<GenericModelItem_*> *)&__range1,(GenericModelItem **)&i.i.i.bucket);
    }
    QList<QModelIndex>::const_iterator::operator++(&__end1);
  }
  QSet<GenericModelItem_*>::begin((QSet<GenericModelItem_*> *)local_80);
  do {
    QSet<GenericModelItem_*>::end((QSet<GenericModelItem_*> *)local_90);
    bVar2 = QSet<GenericModelItem_*>::iterator::operator!=
                      ((iterator *)local_80,(iterator *)local_90);
    if (!bVar2) {
      QByteArray::QByteArray((QByteArray *)local_110);
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)((long)&i_1.i.i.bucket + 4),WriteOnly);
      QDataStream::QDataStream
                (local_130,(QByteArray *)local_110,(QFlags_conflict1 *)(ulong)i_1.i.i.bucket._4_4_);
      qVar3 = QSet<GenericModelItem_*>::size((QSet<GenericModelItem_*> *)&__range1);
      QDataStream::operator<<(local_130,(int)qVar3);
      QSet<GenericModelItem_*>::begin((QSet<GenericModelItem_*> *)local_148);
      while( true ) {
        QSet<GenericModelItem_*>::end((QSet<GenericModelItem_*> *)&local_158);
        bVar2 = QSet<GenericModelItem_*>::iterator::operator!=((iterator *)local_148,&local_158);
        if (!bVar2) break;
        ppGVar4 = QSet<GenericModelItem_*>::iterator::operator*((iterator *)local_148);
        ::operator<<(local_130,*ppGVar4);
        QSet<GenericModelItem_*>::iterator::operator++((iterator *)local_148);
      }
      mimeDataName(&local_170,this);
      QMimeData::setData((QString *)data,(QByteArray *)&local_170);
      QString::~QString(&local_170);
      QDataStream::~QDataStream(local_130);
      QByteArray::~QByteArray((QByteArray *)local_110);
      QSet<GenericModelItem_*>::~QSet((QSet<GenericModelItem_*> *)&__range1);
      return;
    }
    j.i.i.bucket._7_1_ = 0;
    QSet<GenericModelItem_*>::iterator::iterator((iterator *)local_a8,(iterator *)local_80);
    QSet<GenericModelItem_*>::iterator::operator++((iterator *)local_a8);
    while( true ) {
      QSet<GenericModelItem_*>::end((QSet<GenericModelItem_*> *)&local_b8);
      bVar2 = QSet<GenericModelItem_*>::iterator::operator!=((iterator *)local_a8,&local_b8);
      if (!bVar2) break;
      ppGVar4 = QSet<GenericModelItem_*>::iterator::operator*((iterator *)local_80);
      pGVar1 = *ppGVar4;
      ppGVar4 = QSet<GenericModelItem_*>::iterator::operator*((iterator *)local_a8);
      bVar2 = GenericModelItem::isAnchestor(pGVar1,*ppGVar4);
      if (bVar2) {
        QSet<GenericModelItem_*>::const_iterator::const_iterator(&local_d8,(iterator *)local_a8);
        QSet<GenericModelItem_*>::erase
                  ((QSet<GenericModelItem_*> *)&local_c8,(const_iterator *)&__range1);
        QSet<GenericModelItem_*>::iterator::operator=((iterator *)local_a8,&local_c8);
      }
      else {
        ppGVar4 = QSet<GenericModelItem_*>::iterator::operator*((iterator *)local_a8);
        pGVar1 = *ppGVar4;
        ppGVar4 = QSet<GenericModelItem_*>::iterator::operator*((iterator *)local_80);
        bVar2 = GenericModelItem::isAnchestor(pGVar1,*ppGVar4);
        if (bVar2) {
          j.i.i.bucket._7_1_ = 1;
          break;
        }
        QSet<GenericModelItem_*>::iterator::operator++((iterator *)local_a8);
      }
    }
    if ((j.i.i.bucket._7_1_ & 1) == 0) {
      QSet<GenericModelItem_*>::iterator::operator++((iterator *)local_80);
    }
    else {
      QSet<GenericModelItem_*>::const_iterator::const_iterator
                ((const_iterator *)&encoded.d.size,(iterator *)local_80);
      QSet<GenericModelItem_*>::erase
                ((QSet<GenericModelItem_*> *)&local_e8,(const_iterator *)&__range1);
      QSet<GenericModelItem_*>::iterator::operator=((iterator *)local_80,&local_e8);
    }
  } while( true );
}

Assistant:

void GenericModelPrivate::encodeMime(QMimeData *data, const QModelIndexList &indexes) const
{
    Q_ASSERT(data);
    Q_Q(const GenericModel);
    QSet<GenericModelItem *> itemsToSave;
    for (auto &&idx : indexes) {
        if (!idx.isValid())
            continue;
        Q_ASSERT(idx.model() == q);
        itemsToSave << itemForIndex(idx);
    }
    for (auto i = itemsToSave.begin(); i != itemsToSave.end();) {
        bool iToErase = false;
        auto j = i;
        for (++j; j != itemsToSave.end();) {
            if (GenericModelItem::isAnchestor(*i, *j)) {
                j = itemsToSave.erase(j);
                continue;
            }
            if (GenericModelItem::isAnchestor(*j, *i)) {
                iToErase = true;
                break;
            }
            ++j;
        }
        if (iToErase)
            i = itemsToSave.erase(i);
        else
            ++i;
    }
    QByteArray encoded;
    QDataStream stream(&encoded, QIODevice::WriteOnly);
    stream << qint32(itemsToSave.size());
    for (auto i = itemsToSave.begin(); i != itemsToSave.end(); ++i)
        stream << **i;
    data->setData(mimeDataName(), encoded);
}